

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_tests.cpp
# Opt level: O2

void __thiscall rpc_tests::rpc_ban::test_method(rpc_ban *this)

{
  string args;
  string args_00;
  string args_01;
  string args_02;
  string args_03;
  string args_04;
  string args_05;
  string args_06;
  string args_07;
  string args_08;
  string args_09;
  string args_10;
  string args_11;
  string args_12;
  string args_13;
  string args_14;
  string args_15;
  string args_16;
  string args_17;
  string args_18;
  string args_19;
  string args_20;
  string args_21;
  string args_22;
  string args_23;
  string args_24;
  string args_25;
  UniValue *pUVar1;
  string *psVar2;
  long lVar3;
  iterator in_R8;
  iterator pvVar4;
  iterator in_R9;
  iterator pvVar5;
  int64_t *piVar6;
  assertion_result *paVar8;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  string_view key;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  string_view key_00;
  string_view key_01;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string file_14;
  string_view key_02;
  string_view key_03;
  string_view key_04;
  string_view key_05;
  string_view key_06;
  const_string file_15;
  const_string file_16;
  const_string file_17;
  const_string file_18;
  const_string file_19;
  const_string file_20;
  const_string file_21;
  const_string file_22;
  const_string file_23;
  const_string file_24;
  const_string file_25;
  const_string file_26;
  const_string file_27;
  const_string file_28;
  const_string file_29;
  const_string file_30;
  const_string file_31;
  const_string file_32;
  const_string file_33;
  string_view key_07;
  const_string file_34;
  const_string file_35;
  const_string file_36;
  const_string file_37;
  string_view key_08;
  const_string file_38;
  const_string file_39;
  const_string file_40;
  const_string file_41;
  string_view key_09;
  const_string file_42;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  const_string msg_17;
  const_string msg_18;
  const_string msg_19;
  const_string msg_20;
  const_string msg_21;
  const_string msg_22;
  const_string msg_23;
  const_string msg_24;
  const_string msg_25;
  const_string msg_26;
  const_string msg_27;
  const_string msg_28;
  const_string msg_29;
  const_string msg_30;
  const_string msg_31;
  const_string msg_32;
  const_string msg_33;
  const_string msg_34;
  const_string msg_35;
  const_string msg_36;
  const_string msg_37;
  const_string msg_38;
  const_string msg_39;
  const_string msg_40;
  const_string msg_41;
  const_string msg_42;
  undefined4 in_stack_ffffffffffffead8;
  undefined4 uVar9;
  undefined4 in_stack_ffffffffffffeadc;
  undefined4 uVar10;
  check_type cVar16;
  char *pcVar11;
  undefined4 *puVar12;
  undefined4 *puVar13;
  undefined8 in_stack_ffffffffffffeae8;
  char *pcVar14;
  rpc_ban *this_00;
  rpc_ban *prVar15;
  char *local_1508;
  char *local_1500;
  undefined1 *local_14f8;
  undefined1 *local_14f0;
  char *local_14e8;
  char *local_14e0;
  char *local_14a8;
  char *local_14a0;
  undefined1 *local_1498;
  undefined1 *local_1490;
  char *local_1488;
  char *local_1480;
  char *local_1448;
  char *local_1440;
  undefined1 *local_1438;
  undefined1 *local_1430;
  char *local_1428;
  char *local_1420;
  char *local_13e8;
  char *local_13e0;
  undefined1 *local_13d8;
  undefined1 *local_13d0;
  char *local_13c8;
  char *local_13c0;
  char *local_13b8;
  char *local_13b0;
  undefined1 *local_13a8;
  undefined1 *local_13a0;
  char *local_1398;
  char *local_1390;
  char *local_1358;
  char *local_1350;
  undefined1 *local_1348;
  undefined1 *local_1340;
  char *local_1338;
  char *local_1330;
  char *local_12f8;
  char *local_12f0;
  undefined1 *local_12e8;
  undefined1 *local_12e0;
  char *local_12d8;
  char *local_12d0;
  char *local_1298;
  char *local_1290;
  undefined1 *local_1288;
  undefined1 *local_1280;
  char *local_1278;
  char *local_1270;
  char *local_1268;
  char *local_1260;
  undefined1 *local_1258;
  undefined1 *local_1250;
  char *local_1248;
  char *local_1240;
  char *local_1208;
  char *local_1200;
  undefined1 *local_11f8;
  undefined1 *local_11f0;
  char *local_11e8;
  char *local_11e0;
  char *local_11a8;
  char *local_11a0;
  undefined1 *local_1198;
  undefined1 *local_1190;
  char *local_1188;
  char *local_1180;
  char *local_1148;
  char *local_1140;
  undefined1 *local_1138;
  undefined1 *local_1130;
  char *local_1128;
  char *local_1120;
  undefined1 *local_1118;
  undefined1 *local_1110;
  char *local_1108;
  char *local_1100;
  char *local_10f8;
  char *local_10f0;
  undefined1 *local_10e8;
  undefined1 *local_10e0;
  char *local_10d8;
  char *local_10d0;
  char *local_1098;
  char *local_1090;
  undefined1 *local_1088;
  undefined1 *local_1080;
  char *local_1078;
  char *local_1070;
  char *local_1038;
  char *local_1030;
  undefined1 *local_1028;
  undefined1 *local_1020;
  char *local_1018;
  char *local_1010;
  char *local_fd8;
  char *local_fd0;
  undefined1 *local_fc8;
  undefined1 *local_fc0;
  char *local_fb8;
  char *local_fb0;
  undefined1 *local_fa8;
  undefined1 *local_fa0;
  char *local_f98;
  char *local_f90;
  char *local_f58;
  char *local_f50;
  undefined1 *local_f48;
  undefined1 *local_f40;
  char *local_f38;
  char *local_f30;
  undefined4 local_f24;
  char *local_f20;
  char *local_f18;
  undefined1 *local_f10;
  undefined1 *local_f08;
  char *local_f00;
  char *local_ef8;
  char *local_ec0;
  char *local_eb8;
  undefined1 *local_eb0;
  undefined1 *local_ea8;
  char *local_ea0;
  char *local_e98;
  char *local_e60;
  char *local_e58;
  undefined1 *local_e50;
  undefined1 *local_e48;
  char *local_e40;
  char *local_e38;
  char *local_e00;
  char *local_df8;
  undefined1 *local_df0;
  undefined1 *local_de8;
  char *local_de0;
  char *local_dd8;
  undefined1 *local_dd0;
  undefined1 *local_dc8;
  char *local_dc0;
  char *local_db8;
  char *local_db0;
  char *local_da8;
  undefined1 *local_da0;
  undefined1 *local_d98;
  char *local_d90;
  char *local_d88;
  char *local_d80;
  char *local_d78;
  undefined1 *local_d70;
  undefined1 *local_d68;
  char *local_d60;
  char *local_d58;
  char *local_d50;
  char *local_d48;
  undefined1 *local_d40;
  undefined1 *local_d38;
  char *local_d30;
  char *local_d28;
  char *local_d20;
  char *local_d18;
  undefined1 *local_d10;
  undefined1 *local_d08;
  char *local_d00;
  char *local_cf8;
  int64_t time_remaining;
  int64_t ban_duration;
  char *local_cb0;
  char *local_ca8;
  undefined1 *local_ca0;
  undefined1 *local_c98;
  char *local_c90;
  char *local_c88;
  int64_t time_remaining_expected;
  char *local_c48;
  char *local_c40;
  undefined1 *local_c38;
  undefined1 *local_c30;
  char *local_c28;
  char *local_c20;
  char *local_be8;
  char *local_be0;
  undefined1 *local_bd8;
  undefined1 *local_bd0;
  char *local_bc8;
  char *local_bc0;
  char *local_bb8;
  char *local_bb0;
  undefined1 *local_ba8;
  undefined1 *local_ba0;
  char *local_b98;
  char *local_b90;
  char *local_b88;
  char *local_b80;
  undefined1 *local_b78;
  undefined1 *local_b70;
  char *local_b68;
  char *local_b60;
  int64_t banned_until;
  char *local_b20;
  char *local_b18;
  undefined1 *local_b10;
  undefined1 *local_b08;
  char *local_b00;
  char *local_af8;
  char *local_ac0;
  char *local_ab8;
  undefined1 *local_ab0;
  undefined1 *local_aa8;
  char *local_aa0;
  char *local_a98;
  char *local_a90;
  char *local_a88;
  undefined1 *local_a80;
  undefined1 *local_a78;
  char *local_a70;
  char *local_a68;
  char *local_a30;
  char *local_a28;
  undefined1 *local_a20;
  undefined1 *local_a18;
  char *local_a10;
  char *local_a08;
  char *local_9d0;
  char *local_9c8;
  assertion_result local_9c0;
  undefined1 *local_9a8;
  undefined1 *local_9a0;
  char *local_998;
  char *local_990;
  char *local_988;
  char *local_980;
  undefined1 *local_978;
  undefined1 *local_970;
  char *local_968;
  char *local_960;
  char *local_928;
  char *local_920;
  undefined1 *local_918;
  undefined1 *local_910;
  char *local_908;
  char *local_900;
  char *local_8c8;
  char *local_8c0;
  undefined1 *local_8b8;
  undefined1 *local_8b0;
  char *local_8a8;
  char *local_8a0;
  undefined1 *local_898;
  undefined1 *local_890;
  char *local_888;
  char *local_880;
  char *local_848;
  char *local_840;
  undefined1 *local_838;
  undefined1 *local_830;
  char *local_828;
  char *local_820;
  char *local_7e8;
  char *local_7e0;
  undefined1 *local_7d8;
  undefined1 *local_7d0;
  char *local_7c8;
  char *local_7c0;
  string local_7b8 [32];
  string local_798 [32];
  string local_778 [32];
  UniValue local_758;
  string local_700 [32];
  string local_6e0 [32];
  string local_6c0 [32];
  UniValue local_6a0;
  string local_648 [32];
  string local_628 [32];
  string local_608 [32];
  string local_5e8 [32];
  string local_5c8 [32];
  UniValue local_5a8;
  string local_550 [32];
  string local_530 [32];
  string local_510 [32];
  string local_4f0 [32];
  UniValue local_4d0;
  string local_478 [32];
  string local_458 [32];
  string local_438 [32];
  string local_418 [32];
  UniValue local_3f8;
  string local_3a0 [32];
  string local_380 [32];
  string local_360 [32];
  undefined1 local_340 [16];
  undefined1 *local_330;
  char *local_328 [8];
  string local_2e8 [32];
  UniValue local_2c8;
  UniValue adr;
  UniValue o1;
  string local_1c0 [32];
  string local_1a0 [32];
  string local_180 [32];
  UniValue ar;
  UniValue r;
  string local_b0 [32];
  UniValue local_90;
  long local_38;
  int64_t *piVar7;
  
  local_1030 = (char *)0x0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = this;
  std::__cxx11::string::string<std::allocator<char>>(local_b0,"clearbanned",(allocator<char> *)&r);
  args._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffeadc;
  args._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffead8;
  args._M_string_length = (size_type)_cVar16;
  args.field_2._M_allocated_capacity = in_stack_ffffffffffffeae8;
  args.field_2._8_8_ = this_00;
  RPCTestingSetup::CallRPC(&local_90,&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,args);
  UniValue::~UniValue(&local_90);
  std::__cxx11::string::~string(local_b0);
  local_7c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_7c0 = "";
  local_7d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_7d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x13c;
  file.m_begin = (iterator)&local_7c8;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_7d8,msg);
  ar.typ._0_1_ = 1;
  ar.val._M_dataplus._M_p = (pointer)0x0;
  ar.val._M_string_length = 0;
  r.val._M_dataplus._M_p = r.val._M_dataplus._M_p & 0xffffffffffffff00;
  r._0_8_ = &PTR__lazy_ostream_0114b7d0;
  r.val._M_string_length = (size_type)boost::unit_test::lazy_ostream::inst;
  r.val.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_da8fb0;
  local_7e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_7e0 = "";
  uVar9 = 0;
  uVar10 = 0;
  pvVar4 = &DAT_00000001;
  pvVar5 = &DAT_00000001;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&ar,(lazy_ostream *)&r,1,1,WARN,_cVar16,(size_t)&local_7e8,0x13c);
  boost::detail::shared_count::~shared_count((shared_count *)&ar.val._M_string_length);
  r.val._M_dataplus._M_p = (pointer)&r.val.field_2;
  r.val._M_string_length = 0;
  r.val.field_2._M_allocated_capacity = r.val.field_2._M_allocated_capacity & 0xffffffffffffff00;
  r._0_8_ = r._0_8_ & 0xffffffff00000000;
  r.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  r.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  r.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  r.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  r.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  r.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            (local_180,"setban 127.0.0.0 add",(allocator<char> *)&o1);
  args_00._M_dataplus._M_p._4_4_ = uVar10;
  args_00._M_dataplus._M_p._0_4_ = uVar9;
  args_00._M_string_length = (size_type)_cVar16;
  args_00.field_2._M_allocated_capacity = in_stack_ffffffffffffeae8;
  args_00.field_2._8_8_ = this_00;
  RPCTestingSetup::CallRPC(&ar,&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,args_00);
  UniValue::operator=(&r,&ar);
  UniValue::~UniValue(&ar);
  std::__cxx11::string::~string(local_180);
  local_828 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_820 = "";
  local_838 = &boost::unit_test::basic_cstring<char_const>::null;
  local_830 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x13f;
  file_00.m_begin = (iterator)&local_828;
  msg_00.m_end = pvVar5;
  msg_00.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_838,
             msg_00);
  o1.typ._0_1_ = VOBJ;
  o1.val._M_dataplus._M_p = (pointer)0x0;
  o1.val._M_string_length = 0;
  ar.val._M_dataplus._M_p = ar.val._M_dataplus._M_p & 0xffffffffffffff00;
  ar._0_8_ = &PTR__lazy_ostream_01149290;
  ar.val._M_string_length = (size_type)boost::unit_test::lazy_ostream::inst;
  ar.val.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_da8fe5;
  local_848 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_840 = "";
  uVar9 = 0;
  uVar10 = 0;
  pvVar4 = &DAT_00000001;
  pvVar5 = &DAT_00000001;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&o1,(lazy_ostream *)&ar,1,1,WARN,_cVar16,(size_t)&local_848,0x13f);
  boost::detail::shared_count::~shared_count((shared_count *)&o1.val._M_string_length);
  local_888 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_880 = "";
  local_898 = &boost::unit_test::basic_cstring<char_const>::null;
  local_890 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x140;
  file_01.m_begin = (iterator)&local_888;
  msg_01.m_end = pvVar5;
  msg_01.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_898,
             msg_01);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1a0,"setban 127.0.0.0:8334",(allocator<char> *)&o1);
  args_01._M_dataplus._M_p._4_4_ = uVar10;
  args_01._M_dataplus._M_p._0_4_ = uVar9;
  args_01._M_string_length = (size_type)_cVar16;
  args_01.field_2._M_allocated_capacity = in_stack_ffffffffffffeae8;
  args_01.field_2._8_8_ = this_00;
  RPCTestingSetup::CallRPC(&ar,&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,args_01);
  UniValue::operator=(&r,&ar);
  UniValue::~UniValue(&ar);
  std::__cxx11::string::~string(local_1a0);
  local_8a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_8a0 = "";
  local_8b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_8b0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x140;
  file_02.m_begin = (iterator)&local_8a8;
  msg_02.m_end = pvVar5;
  msg_02.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_8b8,
             msg_02);
  o1.typ._0_1_ = VNULL;
  o1.val._M_dataplus._M_p = (pointer)0x0;
  o1.val._M_string_length = 0;
  ar.val._M_dataplus._M_p = ar.val._M_dataplus._M_p & 0xffffffffffffff00;
  ar._0_8_ = &PTR__lazy_ostream_011489c8;
  ar.val._M_string_length = (size_type)boost::unit_test::lazy_ostream::inst;
  ar.val.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_1b9072;
  local_8c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_8c0 = "";
  uVar9 = 0;
  uVar10 = 0;
  pvVar4 = &DAT_00000001;
  pvVar5 = &DAT_00000001;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&o1,(lazy_ostream *)&ar,1,1,WARN,_cVar16,(size_t)&local_8c8,0x140);
  boost::detail::shared_count::~shared_count((shared_count *)&o1.val._M_string_length);
  std::__cxx11::string::string<std::allocator<char>>(local_1c0,"listbanned",(allocator<char> *)&o1);
  args_02._M_dataplus._M_p._4_4_ = uVar10;
  args_02._M_dataplus._M_p._0_4_ = uVar9;
  args_02._M_string_length = (size_type)_cVar16;
  args_02.field_2._M_allocated_capacity = in_stack_ffffffffffffeae8;
  args_02.field_2._8_8_ = this_00;
  RPCTestingSetup::CallRPC(&ar,&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,args_02);
  UniValue::operator=(&r,&ar);
  UniValue::~UniValue(&ar);
  std::__cxx11::string::~string(local_1c0);
  local_908 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_900 = "";
  local_918 = &boost::unit_test::basic_cstring<char_const>::null;
  local_910 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x141;
  file_03.m_begin = (iterator)&local_908;
  msg_03.m_end = pvVar5;
  msg_03.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_918,
             msg_03);
  o1.typ._0_1_ = VOBJ;
  o1.val._M_dataplus._M_p = (pointer)0x0;
  o1.val._M_string_length = 0;
  ar.val._M_dataplus._M_p = ar.val._M_dataplus._M_p & 0xffffffffffffff00;
  ar._0_8_ = &PTR__lazy_ostream_01149250;
  ar.val._M_string_length = (size_type)boost::unit_test::lazy_ostream::inst;
  ar.val.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_da9027;
  local_928 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_920 = "";
  pvVar4 = &DAT_00000001;
  pvVar5 = &DAT_00000001;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&o1,(lazy_ostream *)&ar,1,1,WARN,_cVar16,(size_t)&local_928,0x141);
  boost::detail::shared_count::~shared_count((shared_count *)&o1.val._M_string_length);
  pUVar1 = UniValue::get_array(&r);
  UniValue::UniValue(&ar,pUVar1);
  pUVar1 = UniValue::operator[](&ar,0);
  pUVar1 = UniValue::get_obj(pUVar1);
  UniValue::UniValue(&o1,pUVar1);
  key._M_str = "address";
  key._M_len = 7;
  pUVar1 = UniValue::find_value(&o1,key);
  UniValue::UniValue(&adr,pUVar1);
  local_968 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_960 = "";
  local_978 = &boost::unit_test::basic_cstring<char_const>::null;
  local_970 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x145;
  file_04.m_begin = (iterator)&local_968;
  msg_04.m_end = pvVar5;
  msg_04.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_978,
             msg_04);
  local_340[8] = false;
  local_340._0_8_ = &PTR__lazy_ostream_011480b0;
  local_330 = boost::unit_test::lazy_ostream::inst;
  local_328[0] = (char *)((long)"\x05\x04\x03\x02\x01" + 5);
  local_988 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_980 = "";
  psVar2 = UniValue::get_str_abi_cxx11_(&adr);
  pcVar14 = "\"127.0.0.0/32\"";
  pcVar11 = "127.0.0.0/32";
  uVar9 = 0xbd3ed0;
  uVar10 = 0;
  pvVar4 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[13]>
            (local_340,&local_988,0x145,1);
  std::__cxx11::string::string<std::allocator<char>>
            (local_2e8,"setban 127.0.0.0 remove",(allocator<char> *)local_340);
  args_03._M_dataplus._M_p._4_4_ = uVar10;
  args_03._M_dataplus._M_p._0_4_ = uVar9;
  args_03._M_string_length = (size_type)pcVar11;
  args_03.field_2._M_allocated_capacity = (size_type)pcVar14;
  args_03.field_2._8_8_ = this_00;
  RPCTestingSetup::CallRPC(&local_2c8,&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,args_03);
  UniValue::~UniValue(&local_2c8);
  std::__cxx11::string::~string(local_2e8);
  local_998 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_990 = "";
  local_9a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_9a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x146;
  file_05.m_begin = (iterator)&local_998;
  msg_05.m_end = (iterator)psVar2;
  msg_05.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_9a8,
             msg_05);
  local_9c0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x1;
  local_9c0.m_message.px = (element_type *)0x0;
  local_9c0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_340[8] = false;
  local_340._0_8_ = &PTR__lazy_ostream_0114b890;
  local_330 = boost::unit_test::lazy_ostream::inst;
  local_328[0] = "no exceptions thrown by CallRPC(std::string(\"setban 127.0.0.0 remove\"))";
  local_9d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_9c8 = "";
  uVar9 = 0;
  uVar10 = 0;
  pvVar4 = &DAT_00000001;
  pvVar5 = &DAT_00000001;
  boost::test_tools::tt_detail::report_assertion
            (&local_9c0,(lazy_ostream *)local_340,1,1,WARN,(check_type)pcVar11,(size_t)&local_9d0,
             0x146);
  boost::detail::shared_count::~shared_count(&local_9c0.m_message.pn);
  std::__cxx11::string::string<std::allocator<char>>
            (local_360,"listbanned",(allocator<char> *)&local_9c0);
  args_04._M_dataplus._M_p._4_4_ = uVar10;
  args_04._M_dataplus._M_p._0_4_ = uVar9;
  args_04._M_string_length = (size_type)pcVar11;
  args_04.field_2._M_allocated_capacity = (size_type)pcVar14;
  args_04.field_2._8_8_ = this_00;
  RPCTestingSetup::CallRPC((UniValue *)local_340,&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,args_04);
  UniValue::operator=(&r,(UniValue *)local_340);
  UniValue::~UniValue((UniValue *)local_340);
  std::__cxx11::string::~string(local_360);
  local_a10 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_a08 = "";
  local_a20 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a18 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x147;
  file_06.m_begin = (iterator)&local_a10;
  msg_06.m_end = pvVar5;
  msg_06.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_a20,
             msg_06);
  local_9c0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)0x1;
  local_9c0.m_message.px = (element_type *)0x0;
  local_9c0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_340[8] = false;
  local_340._0_8_ = &PTR__lazy_ostream_01149250;
  local_330 = boost::unit_test::lazy_ostream::inst;
  local_328[0] = "no exceptions thrown by r = CallRPC(std::string(\"listbanned\"))";
  local_a30 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_a28 = "";
  pvVar4 = &DAT_00000001;
  pvVar5 = &DAT_00000001;
  boost::test_tools::tt_detail::report_assertion
            (&local_9c0,(lazy_ostream *)local_340,1,1,WARN,(check_type)pcVar11,(size_t)&local_a30,
             0x147);
  boost::detail::shared_count::~shared_count(&local_9c0.m_message.pn);
  pUVar1 = UniValue::get_array(&r);
  UniValue::operator=(&ar,pUVar1);
  local_a70 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_a68 = "";
  local_a80 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a78 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0x149;
  file_07.m_begin = (iterator)&local_a70;
  msg_07.m_end = pvVar5;
  msg_07.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_a80,
             msg_07);
  local_340[8] = false;
  local_340._0_8_ = &PTR__lazy_ostream_011480b0;
  local_330 = boost::unit_test::lazy_ostream::inst;
  local_328[0] = (char *)((long)"\x05\x04\x03\x02\x01" + 5);
  local_a90 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_a88 = "";
  local_9c0._0_8_ =
       ((long)ar.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
              super__Vector_impl_data._M_finish -
       (long)ar.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
             super__Vector_impl_data._M_start) / 0x58;
  paVar8 = &local_9c0;
  piVar6 = &banned_until;
  banned_until = (ulong)banned_until._4_4_ << 0x20;
  pcVar11 = "0U";
  uVar9 = 0xbd3fa9;
  uVar10 = 0;
  pvVar4 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (local_340,&local_a90,0x149,1);
  std::__cxx11::string::string<std::allocator<char>>
            (local_380,"setban 127.0.0.0/24 add 9907731200 true",(allocator<char> *)&local_9c0);
  args_05._M_dataplus._M_p._4_4_ = uVar10;
  args_05._M_dataplus._M_p._0_4_ = uVar9;
  args_05._M_string_length = (size_type)piVar6;
  args_05.field_2._M_allocated_capacity = (size_type)pcVar11;
  args_05.field_2._8_8_ = this_00;
  RPCTestingSetup::CallRPC((UniValue *)local_340,&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,args_05);
  UniValue::operator=(&r,(UniValue *)local_340);
  UniValue::~UniValue((UniValue *)local_340);
  std::__cxx11::string::~string(local_380);
  local_aa0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_a98 = "";
  local_ab0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_aa8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0x14b;
  file_08.m_begin = (iterator)&local_aa0;
  msg_08.m_end = (iterator)paVar8;
  msg_08.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_ab0,
             msg_08);
  local_9c0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x1;
  local_9c0.m_message.px = (element_type *)0x0;
  local_9c0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_340[8] = false;
  local_340._0_8_ = &PTR__lazy_ostream_0114b910;
  local_330 = boost::unit_test::lazy_ostream::inst;
  local_328[0] = 
  "no exceptions thrown by r = CallRPC(std::string(\"setban 127.0.0.0/24 add 9907731200 true\"))";
  local_ac0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_ab8 = "";
  uVar9 = 0;
  uVar10 = 0;
  pvVar4 = &DAT_00000001;
  pvVar5 = &DAT_00000001;
  boost::test_tools::tt_detail::report_assertion
            (&local_9c0,(lazy_ostream *)local_340,1,1,WARN,(check_type)piVar6,(size_t)&local_ac0,
             0x14b);
  boost::detail::shared_count::~shared_count(&local_9c0.m_message.pn);
  paVar8 = &local_9c0;
  std::__cxx11::string::string<std::allocator<char>>
            (local_3a0,"listbanned",(allocator<char> *)paVar8);
  args_06._M_dataplus._M_p._4_4_ = uVar10;
  args_06._M_dataplus._M_p._0_4_ = uVar9;
  args_06._M_string_length = (size_type)piVar6;
  args_06.field_2._M_allocated_capacity = (size_type)pcVar11;
  args_06.field_2._8_8_ = this_00;
  RPCTestingSetup::CallRPC((UniValue *)local_340,&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,args_06);
  UniValue::operator=(&r,(UniValue *)local_340);
  UniValue::~UniValue((UniValue *)local_340);
  std::__cxx11::string::~string(local_3a0);
  local_b00 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_af8 = "";
  local_b10 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b08 = &boost::unit_test::basic_cstring<char_const>::null;
  file_09.m_end = (iterator)0x14c;
  file_09.m_begin = (iterator)&local_b00;
  msg_09.m_end = pvVar5;
  msg_09.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_b10,
             msg_09);
  local_9c0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)0x1;
  local_9c0.m_message.px = (element_type *)0x0;
  local_9c0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_340[8] = false;
  local_340._0_8_ = &PTR__lazy_ostream_01149250;
  local_330 = boost::unit_test::lazy_ostream::inst;
  local_328[0] = "no exceptions thrown by r = CallRPC(std::string(\"listbanned\"))";
  local_b20 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_b18 = "";
  pvVar4 = &DAT_00000001;
  pvVar5 = &DAT_00000001;
  boost::test_tools::tt_detail::report_assertion
            (&local_9c0,(lazy_ostream *)local_340,1,1,WARN,(check_type)piVar6,(size_t)&local_b20,
             0x14c);
  boost::detail::shared_count::~shared_count(&local_9c0.m_message.pn);
  pUVar1 = UniValue::get_array(&r);
  UniValue::operator=(&ar,pUVar1);
  pUVar1 = UniValue::operator[](&ar,0);
  pUVar1 = UniValue::get_obj(pUVar1);
  UniValue::operator=(&o1,pUVar1);
  key_00._M_str = "address";
  key_00._M_len = 7;
  pUVar1 = UniValue::find_value(&o1,key_00);
  UniValue::operator=(&adr,pUVar1);
  key_01._M_str = "banned_until";
  key_01._M_len = 0xc;
  pUVar1 = UniValue::find_value(&o1,key_01);
  banned_until = UniValue::getInt<long>(pUVar1);
  local_b68 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_b60 = "";
  local_b78 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b70 = &boost::unit_test::basic_cstring<char_const>::null;
  file_10.m_end = (iterator)0x151;
  file_10.m_begin = (iterator)&local_b68;
  msg_10.m_end = pvVar5;
  msg_10.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_b78,
             msg_10);
  local_340[8] = false;
  local_340._0_8_ = &PTR__lazy_ostream_011480b0;
  local_330 = boost::unit_test::lazy_ostream::inst;
  local_328[0] = (char *)((long)"\x05\x04\x03\x02\x01" + 5);
  local_b88 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_b80 = "";
  psVar2 = UniValue::get_str_abi_cxx11_(&adr);
  pvVar4 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[13]>
            (local_340,&local_b88,0x151,1,2,psVar2,0xbd3ed0,"127.0.0.0/24","\"127.0.0.0/24\"");
  local_b98 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_b90 = "";
  local_ba8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_ba0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_11.m_end = (iterator)0x152;
  file_11.m_begin = (iterator)&local_b98;
  msg_11.m_end = (iterator)psVar2;
  msg_11.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_ba8,
             msg_11);
  local_340[8] = false;
  local_340._0_8_ = &PTR__lazy_ostream_011480b0;
  local_330 = boost::unit_test::lazy_ostream::inst;
  local_328[0] = (char *)((long)"\x05\x04\x03\x02\x01" + 5);
  local_bb8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_bb0 = "";
  local_9c0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)0x0;
  local_9c0._1_7_ = 0x24e8bfb;
  pcVar11 = "9907731200";
  uVar9 = 0xbd409a;
  uVar10 = 0;
  pvVar4 = (iterator)0x2;
  piVar6 = &banned_until;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
            (local_340,&local_bb8,0x152,1);
  std::__cxx11::string::string<std::allocator<char>>
            (local_418,"clearbanned",(allocator<char> *)local_340);
  args_07._M_dataplus._M_p._4_4_ = uVar10;
  args_07._M_dataplus._M_p._0_4_ = uVar9;
  args_07._M_string_length = (size_type)paVar8;
  args_07.field_2._M_allocated_capacity = (size_type)pcVar11;
  args_07.field_2._8_8_ = this_00;
  RPCTestingSetup::CallRPC(&local_3f8,&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,args_07);
  UniValue::~UniValue(&local_3f8);
  std::__cxx11::string::~string(local_418);
  local_bc8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_bc0 = "";
  local_bd8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_bd0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_12.m_end = (iterator)0x154;
  file_12.m_begin = (iterator)&local_bc8;
  msg_12.m_end = (iterator)piVar6;
  msg_12.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_bd8,
             msg_12);
  local_9c0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x1;
  local_9c0.m_message.px = (element_type *)0x0;
  local_9c0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_340[8] = false;
  local_340._0_8_ = &PTR__lazy_ostream_0114b7d0;
  local_330 = boost::unit_test::lazy_ostream::inst;
  local_328[0] = "no exceptions thrown by CallRPC(std::string(\"clearbanned\"))";
  local_be8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_be0 = "";
  uVar9 = 0;
  uVar10 = 0;
  pvVar4 = &DAT_00000001;
  pvVar5 = &DAT_00000001;
  boost::test_tools::tt_detail::report_assertion
            (&local_9c0,(lazy_ostream *)local_340,1,1,WARN,(check_type)paVar8,(size_t)&local_be8,
             0x154);
  boost::detail::shared_count::~shared_count(&local_9c0.m_message.pn);
  SetMockTime((seconds)0x2710);
  std::__cxx11::string::string<std::allocator<char>>
            (local_438,"setban 127.0.0.0/24 add 200",(allocator<char> *)&local_9c0);
  args_08._M_dataplus._M_p._4_4_ = uVar10;
  args_08._M_dataplus._M_p._0_4_ = uVar9;
  args_08._M_string_length = (size_type)paVar8;
  args_08.field_2._M_allocated_capacity = (size_type)pcVar11;
  args_08.field_2._8_8_ = this_00;
  RPCTestingSetup::CallRPC((UniValue *)local_340,&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,args_08);
  UniValue::operator=(&r,(UniValue *)local_340);
  UniValue::~UniValue((UniValue *)local_340);
  std::__cxx11::string::~string(local_438);
  local_c28 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_c20 = "";
  local_c38 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c30 = &boost::unit_test::basic_cstring<char_const>::null;
  file_13.m_end = (iterator)0x158;
  file_13.m_begin = (iterator)&local_c28;
  msg_13.m_end = pvVar5;
  msg_13.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_c38,
             msg_13);
  local_9c0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x1;
  local_9c0.m_message.px = (element_type *)0x0;
  local_9c0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_340[8] = false;
  local_340._0_8_ = &PTR__lazy_ostream_0114b3d0;
  local_330 = boost::unit_test::lazy_ostream::inst;
  local_328[0] = "no exceptions thrown by r = CallRPC(std::string(\"setban 127.0.0.0/24 add 200\"))"
  ;
  local_c48 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_c40 = "";
  uVar9 = 0;
  uVar10 = 0;
  pvVar4 = &DAT_00000001;
  pvVar5 = &DAT_00000001;
  boost::test_tools::tt_detail::report_assertion
            (&local_9c0,(lazy_ostream *)local_340,1,1,WARN,(check_type)paVar8,(size_t)&local_c48,
             0x158);
  boost::detail::shared_count::~shared_count(&local_9c0.m_message.pn);
  SetMockTime((seconds)0x2712);
  time_remaining_expected = 0xc6;
  std::__cxx11::string::string<std::allocator<char>>
            (local_458,"listbanned",(allocator<char> *)&local_9c0);
  args_09._M_dataplus._M_p._4_4_ = uVar10;
  args_09._M_dataplus._M_p._0_4_ = uVar9;
  args_09._M_string_length = (size_type)paVar8;
  args_09.field_2._M_allocated_capacity = (size_type)pcVar11;
  args_09.field_2._8_8_ = this_00;
  RPCTestingSetup::CallRPC((UniValue *)local_340,&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,args_09);
  UniValue::operator=(&r,(UniValue *)local_340);
  UniValue::~UniValue((UniValue *)local_340);
  std::__cxx11::string::~string(local_458);
  local_c90 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_c88 = "";
  local_ca0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c98 = &boost::unit_test::basic_cstring<char_const>::null;
  file_14.m_end = (iterator)0x15b;
  file_14.m_begin = (iterator)&local_c90;
  msg_14.m_end = pvVar5;
  msg_14.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_ca0,
             msg_14);
  local_9c0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)0x1;
  local_9c0.m_message.px = (element_type *)0x0;
  local_9c0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_340[8] = false;
  local_340._0_8_ = &PTR__lazy_ostream_01149250;
  local_330 = boost::unit_test::lazy_ostream::inst;
  local_328[0] = "no exceptions thrown by r = CallRPC(std::string(\"listbanned\"))";
  local_cb0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_ca8 = "";
  pvVar4 = &DAT_00000001;
  pvVar5 = &DAT_00000001;
  boost::test_tools::tt_detail::report_assertion
            (&local_9c0,(lazy_ostream *)local_340,1,1,WARN,(check_type)paVar8,(size_t)&local_cb0,
             0x15b);
  boost::detail::shared_count::~shared_count(&local_9c0.m_message.pn);
  pUVar1 = UniValue::get_array(&r);
  UniValue::operator=(&ar,pUVar1);
  pUVar1 = UniValue::operator[](&ar,0);
  pUVar1 = UniValue::get_obj(pUVar1);
  UniValue::operator=(&o1,pUVar1);
  key_02._M_str = "address";
  key_02._M_len = 7;
  pUVar1 = UniValue::find_value(&o1,key_02);
  UniValue::operator=(&adr,pUVar1);
  key_03._M_str = "banned_until";
  key_03._M_len = 0xc;
  pUVar1 = UniValue::find_value(&o1,key_03);
  banned_until = UniValue::getInt<long>(pUVar1);
  key_04._M_str = "ban_created";
  key_04._M_len = 0xb;
  pUVar1 = UniValue::find_value(&o1,key_04);
  lVar3 = UniValue::getInt<long>(pUVar1);
  key_05._M_str = "ban_duration";
  key_05._M_len = 0xc;
  pUVar1 = UniValue::find_value(&o1,key_05);
  ban_duration = UniValue::getInt<long>(pUVar1);
  key_06._M_str = "time_remaining";
  key_06._M_len = 0xe;
  pUVar1 = UniValue::find_value(&o1,key_06);
  time_remaining = UniValue::getInt<long>(pUVar1);
  local_d00 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_cf8 = "";
  local_d10 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d08 = &boost::unit_test::basic_cstring<char_const>::null;
  file_15.m_end = (iterator)0x163;
  file_15.m_begin = (iterator)&local_d00;
  msg_15.m_end = pvVar5;
  msg_15.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,(size_t)&local_d10,
             msg_15);
  local_340[8] = false;
  local_340._0_8_ = &PTR__lazy_ostream_011480b0;
  local_330 = boost::unit_test::lazy_ostream::inst;
  local_328[0] = (char *)((long)"\x05\x04\x03\x02\x01" + 5);
  local_d20 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_d18 = "";
  psVar2 = UniValue::get_str_abi_cxx11_(&adr);
  pvVar4 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[13]>
            (local_340,&local_d20,0x163,1,2,psVar2,0xbd3ed0,"127.0.0.0/24","\"127.0.0.0/24\"");
  local_d30 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_d28 = "";
  local_d40 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d38 = &boost::unit_test::basic_cstring<char_const>::null;
  file_16.m_end = (iterator)0x164;
  file_16.m_begin = (iterator)&local_d30;
  msg_16.m_end = (iterator)psVar2;
  msg_16.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,(size_t)&local_d40,
             msg_16);
  local_340[8] = false;
  local_340._0_8_ = &PTR__lazy_ostream_011480b0;
  local_330 = boost::unit_test::lazy_ostream::inst;
  local_328[0] = (char *)((long)"\x05\x04\x03\x02\x01" + 5);
  local_d50 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_d48 = "";
  local_9c0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)0xd8;
  local_9c0._1_7_ = 0x27;
  pvVar4 = (iterator)0x2;
  piVar6 = &banned_until;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
            (local_340,&local_d50,0x164,1,2,piVar6,0xbd409a,&local_9c0,
             "time_remaining_expected + now.count()");
  local_d60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_d58 = "";
  local_d70 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d68 = &boost::unit_test::basic_cstring<char_const>::null;
  file_17.m_end = (iterator)0x165;
  file_17.m_begin = (iterator)&local_d60;
  msg_17.m_end = (iterator)piVar6;
  msg_17.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_17,(size_t)&local_d70,
             msg_17);
  local_340[8] = false;
  local_340._0_8_ = &PTR__lazy_ostream_011480b0;
  local_330 = boost::unit_test::lazy_ostream::inst;
  local_328[0] = (char *)((long)"\x05\x04\x03\x02\x01" + 5);
  local_d80 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_d78 = "";
  local_9c0._0_8_ = banned_until - lVar3;
  pvVar4 = (iterator)0x2;
  piVar6 = &ban_duration;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
            (local_340,&local_d80,0x165,1,2,piVar6,0xbd4191,&local_9c0,"banned_until - ban_created")
  ;
  local_d90 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_d88 = "";
  local_da0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d98 = &boost::unit_test::basic_cstring<char_const>::null;
  file_18.m_end = (iterator)0x166;
  file_18.m_begin = (iterator)&local_d90;
  msg_18.m_end = (iterator)piVar6;
  msg_18.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_18,(size_t)&local_da0,
             msg_18);
  local_340[8] = false;
  local_340._0_8_ = &PTR__lazy_ostream_011480b0;
  local_330 = boost::unit_test::lazy_ostream::inst;
  local_328[0] = (char *)((long)"\x05\x04\x03\x02\x01" + 5);
  local_db0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_da8 = "";
  pcVar11 = "time_remaining_expected";
  piVar6 = &time_remaining_expected;
  uVar9 = 0xbd419e;
  uVar10 = 0;
  pvVar4 = (iterator)0x2;
  piVar7 = &time_remaining;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
            (local_340,&local_db0,0x166,1);
  local_dc0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_db8 = "";
  local_dd0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_dc8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_19.m_end = (iterator)0x169;
  file_19.m_begin = (iterator)&local_dc0;
  msg_19.m_end = (iterator)piVar7;
  msg_19.m_begin = pvVar4;
  prVar15 = this_00;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_19,(size_t)&local_dd0,
             msg_19);
  std::__cxx11::string::string<std::allocator<char>>
            (local_478,"setban 127.0.0.1 add",(allocator<char> *)&local_9c0);
  args_10._M_dataplus._M_p._4_4_ = uVar10;
  args_10._M_dataplus._M_p._0_4_ = uVar9;
  args_10._M_string_length = (size_type)piVar6;
  args_10.field_2._M_allocated_capacity = (size_type)pcVar11;
  args_10.field_2._8_8_ = prVar15;
  RPCTestingSetup::CallRPC
            ((UniValue *)local_340,&this_00->super_BOOST_AUTO_TEST_CASE_FIXTURE,args_10);
  UniValue::operator=(&r,(UniValue *)local_340);
  UniValue::~UniValue((UniValue *)local_340);
  std::__cxx11::string::~string(local_478);
  local_de0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_dd8 = "";
  local_df0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_de8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_20.m_end = (iterator)0x169;
  file_20.m_begin = (iterator)&local_de0;
  msg_20.m_end = (iterator)piVar7;
  msg_20.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_20,(size_t)&local_df0,
             msg_20);
  local_9c0._0_8_ = local_9c0._0_8_ & 0xffffffffffffff00;
  local_9c0.m_message.px = (element_type *)0x0;
  local_9c0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_340[8] = false;
  local_340._0_8_ = &PTR__lazy_ostream_011489c8;
  local_330 = boost::unit_test::lazy_ostream::inst;
  local_328[0] = "exception std::runtime_error expected but not raised";
  local_e00 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_df8 = "";
  uVar9 = 0;
  uVar10 = 0;
  pvVar4 = &DAT_00000001;
  pvVar5 = &DAT_00000001;
  boost::test_tools::tt_detail::report_assertion
            (&local_9c0,(lazy_ostream *)local_340,1,1,WARN,(check_type)piVar6,(size_t)&local_e00,
             0x169);
  boost::detail::shared_count::~shared_count(&local_9c0.m_message.pn);
  std::__cxx11::string::string<std::allocator<char>>
            (local_4f0,"setban 127.0.0.0/24 remove",(allocator<char> *)local_340);
  args_11._M_dataplus._M_p._4_4_ = uVar10;
  args_11._M_dataplus._M_p._0_4_ = uVar9;
  args_11._M_string_length = (size_type)piVar6;
  args_11.field_2._M_allocated_capacity = (size_type)pcVar11;
  args_11.field_2._8_8_ = prVar15;
  RPCTestingSetup::CallRPC(&local_4d0,&this_00->super_BOOST_AUTO_TEST_CASE_FIXTURE,args_11);
  UniValue::~UniValue(&local_4d0);
  std::__cxx11::string::~string(local_4f0);
  local_e40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_e38 = "";
  local_e50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_e48 = &boost::unit_test::basic_cstring<char_const>::null;
  file_21.m_end = (iterator)0x16b;
  file_21.m_begin = (iterator)&local_e40;
  msg_21.m_end = pvVar5;
  msg_21.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_21,(size_t)&local_e50,
             msg_21);
  local_9c0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x1;
  local_9c0.m_message.px = (element_type *)0x0;
  local_9c0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_340[8] = false;
  local_340._0_8_ = &PTR__lazy_ostream_0114b990;
  local_330 = boost::unit_test::lazy_ostream::inst;
  local_328[0] = "no exceptions thrown by CallRPC(std::string(\"setban 127.0.0.0/24 remove\"))";
  local_e60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_e58 = "";
  uVar9 = 0;
  uVar10 = 0;
  pvVar4 = &DAT_00000001;
  pvVar5 = &DAT_00000001;
  boost::test_tools::tt_detail::report_assertion
            (&local_9c0,(lazy_ostream *)local_340,1,1,WARN,(check_type)piVar6,(size_t)&local_e60,
             0x16b);
  boost::detail::shared_count::~shared_count(&local_9c0.m_message.pn);
  std::__cxx11::string::string<std::allocator<char>>
            (local_510,"listbanned",(allocator<char> *)&local_9c0);
  args_12._M_dataplus._M_p._4_4_ = uVar10;
  args_12._M_dataplus._M_p._0_4_ = uVar9;
  args_12._M_string_length = (size_type)piVar6;
  args_12.field_2._M_allocated_capacity = (size_type)pcVar11;
  args_12.field_2._8_8_ = prVar15;
  RPCTestingSetup::CallRPC
            ((UniValue *)local_340,&this_00->super_BOOST_AUTO_TEST_CASE_FIXTURE,args_12);
  UniValue::operator=(&r,(UniValue *)local_340);
  UniValue::~UniValue((UniValue *)local_340);
  std::__cxx11::string::~string(local_510);
  local_ea0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_e98 = "";
  local_eb0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_ea8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_22.m_end = (iterator)0x16c;
  file_22.m_begin = (iterator)&local_ea0;
  msg_22.m_end = pvVar5;
  msg_22.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_22,(size_t)&local_eb0,
             msg_22);
  local_9c0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)0x1;
  local_9c0.m_message.px = (element_type *)0x0;
  local_9c0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_340[8] = false;
  local_340._0_8_ = &PTR__lazy_ostream_01149250;
  local_330 = boost::unit_test::lazy_ostream::inst;
  local_328[0] = "no exceptions thrown by r = CallRPC(std::string(\"listbanned\"))";
  local_ec0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_eb8 = "";
  pvVar4 = &DAT_00000001;
  pvVar5 = &DAT_00000001;
  boost::test_tools::tt_detail::report_assertion
            (&local_9c0,(lazy_ostream *)local_340,1,1,WARN,(check_type)piVar6,(size_t)&local_ec0,
             0x16c);
  boost::detail::shared_count::~shared_count(&local_9c0.m_message.pn);
  pUVar1 = UniValue::get_array(&r);
  UniValue::operator=(&ar,pUVar1);
  local_f00 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_ef8 = "";
  local_f10 = &boost::unit_test::basic_cstring<char_const>::null;
  local_f08 = &boost::unit_test::basic_cstring<char_const>::null;
  file_23.m_end = (iterator)0x16e;
  file_23.m_begin = (iterator)&local_f00;
  msg_23.m_end = pvVar5;
  msg_23.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_23,(size_t)&local_f10,
             msg_23);
  local_340[8] = false;
  local_340._0_8_ = &PTR__lazy_ostream_011480b0;
  local_330 = boost::unit_test::lazy_ostream::inst;
  local_328[0] = (char *)((long)"\x05\x04\x03\x02\x01" + 5);
  local_f20 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_f18 = "";
  local_9c0._0_8_ =
       ((long)ar.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
              super__Vector_impl_data._M_finish -
       (long)ar.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
             super__Vector_impl_data._M_start) / 0x58;
  paVar8 = &local_9c0;
  puVar13 = &local_f24;
  local_f24 = 0;
  pcVar11 = "0U";
  uVar9 = 0xbd3fa9;
  uVar10 = 0;
  pvVar4 = (iterator)0x2;
  puVar12 = puVar13;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (local_340,&local_f20,0x16e,1);
  std::__cxx11::string::string<std::allocator<char>>
            (local_530,"setban 127.0.0.0/255.255.0.0 add",(allocator<char> *)&local_9c0);
  args_13._M_dataplus._M_p._4_4_ = uVar10;
  args_13._M_dataplus._M_p._0_4_ = uVar9;
  args_13._M_string_length = (size_type)puVar12;
  args_13.field_2._M_allocated_capacity = (size_type)pcVar11;
  args_13.field_2._8_8_ = prVar15;
  RPCTestingSetup::CallRPC
            ((UniValue *)local_340,&this_00->super_BOOST_AUTO_TEST_CASE_FIXTURE,args_13);
  UniValue::operator=(&r,(UniValue *)local_340);
  UniValue::~UniValue((UniValue *)local_340);
  std::__cxx11::string::~string(local_530);
  local_f38 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_f30 = "";
  local_f48 = &boost::unit_test::basic_cstring<char_const>::null;
  local_f40 = &boost::unit_test::basic_cstring<char_const>::null;
  file_24.m_end = (iterator)0x170;
  file_24.m_begin = (iterator)&local_f38;
  msg_24.m_end = (iterator)paVar8;
  msg_24.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_24,(size_t)&local_f48,
             msg_24);
  local_9c0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x1;
  local_9c0.m_message.px = (element_type *)0x0;
  local_9c0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_340[8] = false;
  local_340._0_8_ = &PTR__lazy_ostream_0114ba10;
  local_330 = boost::unit_test::lazy_ostream::inst;
  local_328[0] = 
  "no exceptions thrown by r = CallRPC(std::string(\"setban 127.0.0.0/255.255.0.0 add\"))";
  local_f58 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_f50 = "";
  uVar9 = 0;
  uVar10 = 0;
  pvVar4 = &DAT_00000001;
  pvVar5 = &DAT_00000001;
  boost::test_tools::tt_detail::report_assertion
            (&local_9c0,(lazy_ostream *)local_340,1,1,WARN,(check_type)puVar12,(size_t)&local_f58,
             0x170);
  boost::detail::shared_count::~shared_count(&local_9c0.m_message.pn);
  local_f98 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_f90 = "";
  local_fa8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_fa0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_25.m_end = (iterator)0x171;
  file_25.m_begin = (iterator)&local_f98;
  msg_25.m_end = pvVar5;
  msg_25.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_25,(size_t)&local_fa8,
             msg_25);
  std::__cxx11::string::string<std::allocator<char>>
            (local_550,"setban 127.0.1.1 add",(allocator<char> *)&local_9c0);
  args_14._M_dataplus._M_p._4_4_ = uVar10;
  args_14._M_dataplus._M_p._0_4_ = uVar9;
  args_14._M_string_length = (size_type)puVar12;
  args_14.field_2._M_allocated_capacity = (size_type)pcVar11;
  args_14.field_2._8_8_ = prVar15;
  RPCTestingSetup::CallRPC
            ((UniValue *)local_340,&this_00->super_BOOST_AUTO_TEST_CASE_FIXTURE,args_14);
  UniValue::operator=(&r,(UniValue *)local_340);
  UniValue::~UniValue((UniValue *)local_340);
  std::__cxx11::string::~string(local_550);
  local_fb8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_fb0 = "";
  local_fc8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_fc0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_26.m_end = (iterator)0x171;
  file_26.m_begin = (iterator)&local_fb8;
  msg_26.m_end = pvVar5;
  msg_26.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_26,(size_t)&local_fc8,
             msg_26);
  local_9c0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x0;
  local_9c0.m_message.px = (element_type *)0x0;
  local_9c0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_340[8] = false;
  local_340._0_8_ = &PTR__lazy_ostream_011489c8;
  local_330 = boost::unit_test::lazy_ostream::inst;
  local_328[0] = "exception std::runtime_error expected but not raised";
  local_fd8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_fd0 = "";
  uVar9 = 0;
  uVar10 = 0;
  pvVar4 = &DAT_00000001;
  pvVar5 = &DAT_00000001;
  boost::test_tools::tt_detail::report_assertion
            (&local_9c0,(lazy_ostream *)local_340,1,1,WARN,(check_type)puVar12,(size_t)&local_fd8,
             0x171);
  boost::detail::shared_count::~shared_count(&local_9c0.m_message.pn);
  std::__cxx11::string::string<std::allocator<char>>
            (local_5c8,"clearbanned",(allocator<char> *)local_340);
  args_15._M_dataplus._M_p._4_4_ = uVar10;
  args_15._M_dataplus._M_p._0_4_ = uVar9;
  args_15._M_string_length = (size_type)puVar12;
  args_15.field_2._M_allocated_capacity = (size_type)pcVar11;
  args_15.field_2._8_8_ = prVar15;
  RPCTestingSetup::CallRPC(&local_5a8,&this_00->super_BOOST_AUTO_TEST_CASE_FIXTURE,args_15);
  UniValue::~UniValue(&local_5a8);
  std::__cxx11::string::~string(local_5c8);
  local_1018 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_1010 = "";
  local_1028 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1020 = &boost::unit_test::basic_cstring<char_const>::null;
  file_27.m_end = (iterator)0x173;
  file_27.m_begin = (iterator)&local_1018;
  msg_27.m_end = pvVar5;
  msg_27.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_27,(size_t)&local_1028,
             msg_27);
  local_9c0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x1;
  local_9c0.m_message.px = (element_type *)0x0;
  local_9c0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_340[8] = false;
  local_340._0_8_ = &PTR__lazy_ostream_0114b7d0;
  local_330 = boost::unit_test::lazy_ostream::inst;
  local_328[0] = "no exceptions thrown by CallRPC(std::string(\"clearbanned\"))";
  local_1038 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_1030 = "";
  uVar9 = 0;
  uVar10 = 0;
  pvVar4 = &DAT_00000001;
  pvVar5 = &DAT_00000001;
  boost::test_tools::tt_detail::report_assertion
            (&local_9c0,(lazy_ostream *)local_340,1,1,WARN,(check_type)puVar12,(size_t)&local_1038,
             0x173);
  boost::detail::shared_count::~shared_count(&local_9c0.m_message.pn);
  std::__cxx11::string::string<std::allocator<char>>
            (local_5e8,"listbanned",(allocator<char> *)&local_9c0);
  args_16._M_dataplus._M_p._4_4_ = uVar10;
  args_16._M_dataplus._M_p._0_4_ = uVar9;
  args_16._M_string_length = (size_type)puVar12;
  args_16.field_2._M_allocated_capacity = (size_type)pcVar11;
  args_16.field_2._8_8_ = prVar15;
  RPCTestingSetup::CallRPC
            ((UniValue *)local_340,&this_00->super_BOOST_AUTO_TEST_CASE_FIXTURE,args_16);
  UniValue::operator=(&r,(UniValue *)local_340);
  UniValue::~UniValue((UniValue *)local_340);
  std::__cxx11::string::~string(local_5e8);
  local_1078 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_1070 = "";
  local_1088 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1080 = &boost::unit_test::basic_cstring<char_const>::null;
  file_28.m_end = (iterator)0x174;
  file_28.m_begin = (iterator)&local_1078;
  msg_28.m_end = pvVar5;
  msg_28.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_28,(size_t)&local_1088,
             msg_28);
  local_9c0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)0x1;
  local_9c0.m_message.px = (element_type *)0x0;
  local_9c0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_340[8] = false;
  local_340._0_8_ = &PTR__lazy_ostream_01149250;
  local_330 = boost::unit_test::lazy_ostream::inst;
  local_328[0] = "no exceptions thrown by r = CallRPC(std::string(\"listbanned\"))";
  local_1098 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_1090 = "";
  pvVar4 = &DAT_00000001;
  pvVar5 = &DAT_00000001;
  boost::test_tools::tt_detail::report_assertion
            (&local_9c0,(lazy_ostream *)local_340,1,1,WARN,(check_type)puVar12,(size_t)&local_1098,
             0x174);
  boost::detail::shared_count::~shared_count(&local_9c0.m_message.pn);
  pUVar1 = UniValue::get_array(&r);
  UniValue::operator=(&ar,pUVar1);
  local_10d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_10d0 = "";
  local_10e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_10e0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_29.m_end = (iterator)0x176;
  file_29.m_begin = (iterator)&local_10d8;
  msg_29.m_end = pvVar5;
  msg_29.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_29,(size_t)&local_10e8,
             msg_29);
  local_340[8] = false;
  local_340._0_8_ = &PTR__lazy_ostream_011480b0;
  local_330 = boost::unit_test::lazy_ostream::inst;
  local_328[0] = (char *)((long)"\x05\x04\x03\x02\x01" + 5);
  local_10f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_10f0 = "";
  local_9c0._0_8_ =
       ((long)ar.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
              super__Vector_impl_data._M_finish -
       (long)ar.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
             super__Vector_impl_data._M_start) / 0x58;
  paVar8 = &local_9c0;
  local_f24 = 0;
  pcVar11 = "0U";
  uVar9 = 0xbd3fa9;
  uVar10 = 0;
  pvVar4 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (local_340,&local_10f8,0x176,1);
  local_1108 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_1100 = "";
  local_1118 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1110 = &boost::unit_test::basic_cstring<char_const>::null;
  file_30.m_end = (iterator)0x179;
  file_30.m_begin = (iterator)&local_1108;
  msg_30.m_end = (iterator)paVar8;
  msg_30.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_30,(size_t)&local_1118,
             msg_30);
  std::__cxx11::string::string<std::allocator<char>>
            (local_608,"setban test add",(allocator<char> *)&local_9c0);
  args_17._M_dataplus._M_p._4_4_ = uVar10;
  args_17._M_dataplus._M_p._0_4_ = uVar9;
  args_17._M_string_length = (size_type)puVar13;
  args_17.field_2._M_allocated_capacity = (size_type)pcVar11;
  args_17.field_2._8_8_ = prVar15;
  RPCTestingSetup::CallRPC
            ((UniValue *)local_340,&this_00->super_BOOST_AUTO_TEST_CASE_FIXTURE,args_17);
  UniValue::operator=(&r,(UniValue *)local_340);
  UniValue::~UniValue((UniValue *)local_340);
  std::__cxx11::string::~string(local_608);
  local_1128 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_1120 = "";
  local_1138 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1130 = &boost::unit_test::basic_cstring<char_const>::null;
  file_31.m_end = (iterator)0x179;
  file_31.m_begin = (iterator)&local_1128;
  msg_31.m_end = (iterator)paVar8;
  msg_31.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_31,(size_t)&local_1138,
             msg_31);
  local_9c0._0_8_ = local_9c0._0_8_ & 0xffffffffffffff00;
  local_9c0.m_message.px = (element_type *)0x0;
  local_9c0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_340[8] = false;
  local_340._0_8_ = &PTR__lazy_ostream_011489c8;
  local_330 = boost::unit_test::lazy_ostream::inst;
  local_328[0] = "exception std::runtime_error expected but not raised";
  local_1148 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_1140 = "";
  uVar9 = 0;
  uVar10 = 0;
  pvVar4 = &DAT_00000001;
  pvVar5 = &DAT_00000001;
  boost::test_tools::tt_detail::report_assertion
            (&local_9c0,(lazy_ostream *)local_340,1,1,WARN,(check_type)puVar13,(size_t)&local_1148,
             0x179);
  boost::detail::shared_count::~shared_count(&local_9c0.m_message.pn);
  std::__cxx11::string::string<std::allocator<char>>
            (local_628,"setban FE80:0000:0000:0000:0202:B3FF:FE1E:8329 add",
             (allocator<char> *)&local_9c0);
  args_18._M_dataplus._M_p._4_4_ = uVar10;
  args_18._M_dataplus._M_p._0_4_ = uVar9;
  args_18._M_string_length = (size_type)puVar13;
  args_18.field_2._M_allocated_capacity = (size_type)pcVar11;
  args_18.field_2._8_8_ = prVar15;
  RPCTestingSetup::CallRPC
            ((UniValue *)local_340,&this_00->super_BOOST_AUTO_TEST_CASE_FIXTURE,args_18);
  UniValue::operator=(&r,(UniValue *)local_340);
  UniValue::~UniValue((UniValue *)local_340);
  std::__cxx11::string::~string(local_628);
  local_1188 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_1180 = "";
  local_1198 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1190 = &boost::unit_test::basic_cstring<char_const>::null;
  file_32.m_end = (iterator)0x17c;
  file_32.m_begin = (iterator)&local_1188;
  msg_32.m_end = pvVar5;
  msg_32.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_32,(size_t)&local_1198,
             msg_32);
  local_9c0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x1;
  local_9c0.m_message.px = (element_type *)0x0;
  local_9c0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_340[8] = false;
  local_340._0_8_ = &PTR__lazy_ostream_0114ba50;
  local_330 = boost::unit_test::lazy_ostream::inst;
  local_328[0] = 
  "no exceptions thrown by r = CallRPC(std::string(\"setban FE80:0000:0000:0000:0202:B3FF:FE1E:8329 add\"))"
  ;
  local_11a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_11a0 = "";
  uVar9 = 0;
  uVar10 = 0;
  pvVar4 = &DAT_00000001;
  pvVar5 = &DAT_00000001;
  boost::test_tools::tt_detail::report_assertion
            (&local_9c0,(lazy_ostream *)local_340,1,1,WARN,(check_type)puVar13,(size_t)&local_11a8,
             0x17c);
  boost::detail::shared_count::~shared_count(&local_9c0.m_message.pn);
  std::__cxx11::string::string<std::allocator<char>>
            (local_648,"listbanned",(allocator<char> *)&local_9c0);
  args_19._M_dataplus._M_p._4_4_ = uVar10;
  args_19._M_dataplus._M_p._0_4_ = uVar9;
  args_19._M_string_length = (size_type)puVar13;
  args_19.field_2._M_allocated_capacity = (size_type)pcVar11;
  args_19.field_2._8_8_ = prVar15;
  RPCTestingSetup::CallRPC
            ((UniValue *)local_340,&this_00->super_BOOST_AUTO_TEST_CASE_FIXTURE,args_19);
  UniValue::operator=(&r,(UniValue *)local_340);
  UniValue::~UniValue((UniValue *)local_340);
  std::__cxx11::string::~string(local_648);
  local_11e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_11e0 = "";
  local_11f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_11f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_33.m_end = (iterator)0x17d;
  file_33.m_begin = (iterator)&local_11e8;
  msg_33.m_end = pvVar5;
  msg_33.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_33,(size_t)&local_11f8,
             msg_33);
  local_9c0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x1;
  local_9c0.m_message.px = (element_type *)0x0;
  local_9c0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_340[8] = false;
  local_340._0_8_ = &PTR__lazy_ostream_01149250;
  local_330 = boost::unit_test::lazy_ostream::inst;
  local_328[0] = "no exceptions thrown by r = CallRPC(std::string(\"listbanned\"))";
  local_1208 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_1200 = "";
  pvVar4 = &DAT_00000001;
  pvVar5 = &DAT_00000001;
  boost::test_tools::tt_detail::report_assertion
            (&local_9c0,(lazy_ostream *)local_340,1,1,WARN,(check_type)puVar13,(size_t)&local_1208,
             0x17d);
  boost::detail::shared_count::~shared_count(&local_9c0.m_message.pn);
  pUVar1 = UniValue::get_array(&r);
  UniValue::operator=(&ar,pUVar1);
  pUVar1 = UniValue::operator[](&ar,0);
  pUVar1 = UniValue::get_obj(pUVar1);
  UniValue::operator=(&o1,pUVar1);
  key_07._M_str = "address";
  key_07._M_len = 7;
  pUVar1 = UniValue::find_value(&o1,key_07);
  UniValue::operator=(&adr,pUVar1);
  local_1248 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_1240 = "";
  local_1258 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1250 = &boost::unit_test::basic_cstring<char_const>::null;
  file_34.m_end = (iterator)0x181;
  file_34.m_begin = (iterator)&local_1248;
  msg_34.m_end = pvVar5;
  msg_34.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_34,(size_t)&local_1258,
             msg_34);
  local_340[8] = false;
  local_340._0_8_ = &PTR__lazy_ostream_011480b0;
  local_330 = boost::unit_test::lazy_ostream::inst;
  local_328[0] = (char *)((long)"\x05\x04\x03\x02\x01" + 5);
  local_1268 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_1260 = "";
  psVar2 = UniValue::get_str_abi_cxx11_(&adr);
  pcVar14 = "\"fe80::202:b3ff:fe1e:8329/128\"";
  pcVar11 = "fe80::202:b3ff:fe1e:8329/128";
  uVar9 = 0xbd3ed0;
  uVar10 = 0;
  pvVar4 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[29]>
            (local_340,&local_1268,0x181,1);
  std::__cxx11::string::string<std::allocator<char>>
            (local_6c0,"clearbanned",(allocator<char> *)local_340);
  args_20._M_dataplus._M_p._4_4_ = uVar10;
  args_20._M_dataplus._M_p._0_4_ = uVar9;
  args_20._M_string_length = (size_type)pcVar11;
  args_20.field_2._M_allocated_capacity = (size_type)pcVar14;
  args_20.field_2._8_8_ = prVar15;
  RPCTestingSetup::CallRPC(&local_6a0,&this_00->super_BOOST_AUTO_TEST_CASE_FIXTURE,args_20);
  UniValue::~UniValue(&local_6a0);
  std::__cxx11::string::~string(local_6c0);
  local_1278 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_1270 = "";
  local_1288 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1280 = &boost::unit_test::basic_cstring<char_const>::null;
  file_35.m_end = (iterator)0x183;
  file_35.m_begin = (iterator)&local_1278;
  msg_35.m_end = (iterator)psVar2;
  msg_35.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_35,(size_t)&local_1288,
             msg_35);
  local_9c0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x1;
  local_9c0.m_message.px = (element_type *)0x0;
  local_9c0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_340[8] = false;
  local_340._0_8_ = &PTR__lazy_ostream_0114b7d0;
  local_330 = boost::unit_test::lazy_ostream::inst;
  local_328[0] = "no exceptions thrown by CallRPC(std::string(\"clearbanned\"))";
  local_1298 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_1290 = "";
  uVar9 = 0;
  uVar10 = 0;
  pvVar4 = &DAT_00000001;
  pvVar5 = &DAT_00000001;
  boost::test_tools::tt_detail::report_assertion
            (&local_9c0,(lazy_ostream *)local_340,1,1,WARN,(check_type)pcVar11,(size_t)&local_1298,
             0x183);
  boost::detail::shared_count::~shared_count(&local_9c0.m_message.pn);
  std::__cxx11::string::string<std::allocator<char>>
            (local_6e0,"setban 2001:db8::/ffff:fffc:0:0:0:0:0:0 add",(allocator<char> *)&local_9c0);
  args_21._M_dataplus._M_p._4_4_ = uVar10;
  args_21._M_dataplus._M_p._0_4_ = uVar9;
  args_21._M_string_length = (size_type)pcVar11;
  args_21.field_2._M_allocated_capacity = (size_type)pcVar14;
  args_21.field_2._8_8_ = prVar15;
  RPCTestingSetup::CallRPC
            ((UniValue *)local_340,&this_00->super_BOOST_AUTO_TEST_CASE_FIXTURE,args_21);
  UniValue::operator=(&r,(UniValue *)local_340);
  UniValue::~UniValue((UniValue *)local_340);
  std::__cxx11::string::~string(local_6e0);
  local_12d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_12d0 = "";
  local_12e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_12e0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_36.m_end = (iterator)0x184;
  file_36.m_begin = (iterator)&local_12d8;
  msg_36.m_end = pvVar5;
  msg_36.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_36,(size_t)&local_12e8,
             msg_36);
  local_9c0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x1;
  local_9c0.m_message.px = (element_type *)0x0;
  local_9c0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_340[8] = false;
  local_340._0_8_ = &PTR__lazy_ostream_0114a808;
  local_330 = boost::unit_test::lazy_ostream::inst;
  local_328[0] = 
  "no exceptions thrown by r = CallRPC(std::string(\"setban 2001:db8::/ffff:fffc:0:0:0:0:0:0 add\"))"
  ;
  local_12f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_12f0 = "";
  uVar9 = 0;
  uVar10 = 0;
  pvVar4 = &DAT_00000001;
  pvVar5 = &DAT_00000001;
  boost::test_tools::tt_detail::report_assertion
            (&local_9c0,(lazy_ostream *)local_340,1,1,WARN,(check_type)pcVar11,(size_t)&local_12f8,
             0x184);
  boost::detail::shared_count::~shared_count(&local_9c0.m_message.pn);
  std::__cxx11::string::string<std::allocator<char>>
            (local_700,"listbanned",(allocator<char> *)&local_9c0);
  args_22._M_dataplus._M_p._4_4_ = uVar10;
  args_22._M_dataplus._M_p._0_4_ = uVar9;
  args_22._M_string_length = (size_type)pcVar11;
  args_22.field_2._M_allocated_capacity = (size_type)pcVar14;
  args_22.field_2._8_8_ = prVar15;
  RPCTestingSetup::CallRPC
            ((UniValue *)local_340,&this_00->super_BOOST_AUTO_TEST_CASE_FIXTURE,args_22);
  UniValue::operator=(&r,(UniValue *)local_340);
  UniValue::~UniValue((UniValue *)local_340);
  std::__cxx11::string::~string(local_700);
  local_1338 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_1330 = "";
  local_1348 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1340 = &boost::unit_test::basic_cstring<char_const>::null;
  file_37.m_end = (iterator)0x185;
  file_37.m_begin = (iterator)&local_1338;
  msg_37.m_end = pvVar5;
  msg_37.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_37,(size_t)&local_1348,
             msg_37);
  local_9c0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x1;
  local_9c0.m_message.px = (element_type *)0x0;
  local_9c0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_340[8] = false;
  local_340._0_8_ = &PTR__lazy_ostream_01149250;
  local_330 = boost::unit_test::lazy_ostream::inst;
  local_328[0] = "no exceptions thrown by r = CallRPC(std::string(\"listbanned\"))";
  local_1358 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_1350 = "";
  pvVar4 = &DAT_00000001;
  pvVar5 = &DAT_00000001;
  boost::test_tools::tt_detail::report_assertion
            (&local_9c0,(lazy_ostream *)local_340,1,1,WARN,(check_type)pcVar11,(size_t)&local_1358,
             0x185);
  boost::detail::shared_count::~shared_count(&local_9c0.m_message.pn);
  pUVar1 = UniValue::get_array(&r);
  UniValue::operator=(&ar,pUVar1);
  pUVar1 = UniValue::operator[](&ar,0);
  pUVar1 = UniValue::get_obj(pUVar1);
  UniValue::operator=(&o1,pUVar1);
  key_08._M_str = "address";
  key_08._M_len = 7;
  pUVar1 = UniValue::find_value(&o1,key_08);
  UniValue::operator=(&adr,pUVar1);
  local_1398 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_1390 = "";
  local_13a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_13a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_38.m_end = (iterator)0x189;
  file_38.m_begin = (iterator)&local_1398;
  msg_38.m_end = pvVar5;
  msg_38.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_38,(size_t)&local_13a8,
             msg_38);
  local_340[8] = false;
  local_340._0_8_ = &PTR__lazy_ostream_011480b0;
  local_330 = boost::unit_test::lazy_ostream::inst;
  local_328[0] = (char *)((long)"\x05\x04\x03\x02\x01" + 5);
  local_13b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_13b0 = "";
  psVar2 = UniValue::get_str_abi_cxx11_(&adr);
  pcVar14 = "\"2001:db8::/30\"";
  pcVar11 = "2001:db8::/30";
  uVar9 = 0xbd3ed0;
  uVar10 = 0;
  pvVar4 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[14]>
            (local_340,&local_13b8,0x189,1);
  std::__cxx11::string::string<std::allocator<char>>
            (local_778,"clearbanned",(allocator<char> *)local_340);
  args_23._M_dataplus._M_p._4_4_ = uVar10;
  args_23._M_dataplus._M_p._0_4_ = uVar9;
  args_23._M_string_length = (size_type)pcVar11;
  args_23.field_2._M_allocated_capacity = (size_type)pcVar14;
  args_23.field_2._8_8_ = prVar15;
  RPCTestingSetup::CallRPC(&local_758,&this_00->super_BOOST_AUTO_TEST_CASE_FIXTURE,args_23);
  UniValue::~UniValue(&local_758);
  std::__cxx11::string::~string(local_778);
  local_13c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_13c0 = "";
  local_13d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_13d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_39.m_end = (iterator)0x18b;
  file_39.m_begin = (iterator)&local_13c8;
  msg_39.m_end = (iterator)psVar2;
  msg_39.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_39,(size_t)&local_13d8,
             msg_39);
  local_9c0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x1;
  local_9c0.m_message.px = (element_type *)0x0;
  local_9c0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_340[8] = false;
  local_340._0_8_ = &PTR__lazy_ostream_0114b7d0;
  local_330 = boost::unit_test::lazy_ostream::inst;
  local_328[0] = "no exceptions thrown by CallRPC(std::string(\"clearbanned\"))";
  local_13e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_13e0 = "";
  uVar9 = 0;
  uVar10 = 0;
  pvVar4 = &DAT_00000001;
  pvVar5 = &DAT_00000001;
  boost::test_tools::tt_detail::report_assertion
            (&local_9c0,(lazy_ostream *)local_340,1,1,WARN,(check_type)pcVar11,(size_t)&local_13e8,
             0x18b);
  boost::detail::shared_count::~shared_count(&local_9c0.m_message.pn);
  std::__cxx11::string::string<std::allocator<char>>
            (local_798,"setban 2001:4d48:ac57:400:cacf:e9ff:fe1d:9c63/128 add",
             (allocator<char> *)&local_9c0);
  args_24._M_dataplus._M_p._4_4_ = uVar10;
  args_24._M_dataplus._M_p._0_4_ = uVar9;
  args_24._M_string_length = (size_type)pcVar11;
  args_24.field_2._M_allocated_capacity = (size_type)pcVar14;
  args_24.field_2._8_8_ = prVar15;
  RPCTestingSetup::CallRPC
            ((UniValue *)local_340,&this_00->super_BOOST_AUTO_TEST_CASE_FIXTURE,args_24);
  UniValue::operator=(&r,(UniValue *)local_340);
  UniValue::~UniValue((UniValue *)local_340);
  std::__cxx11::string::~string(local_798);
  local_1428 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_1420 = "";
  local_1438 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1430 = &boost::unit_test::basic_cstring<char_const>::null;
  file_40.m_end = (iterator)0x18c;
  file_40.m_begin = (iterator)&local_1428;
  msg_40.m_end = pvVar5;
  msg_40.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_40,(size_t)&local_1438,
             msg_40);
  local_9c0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x1;
  local_9c0.m_message.px = (element_type *)0x0;
  local_9c0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_340[8] = false;
  local_340._0_8_ = &PTR__lazy_ostream_0114bb10;
  local_330 = boost::unit_test::lazy_ostream::inst;
  local_328[0] = 
  "no exceptions thrown by r = CallRPC(std::string(\"setban 2001:4d48:ac57:400:cacf:e9ff:fe1d:9c63/128 add\"))"
  ;
  local_1448 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_1440 = "";
  uVar9 = 0;
  uVar10 = 0;
  pvVar4 = &DAT_00000001;
  pvVar5 = &DAT_00000001;
  boost::test_tools::tt_detail::report_assertion
            (&local_9c0,(lazy_ostream *)local_340,1,1,WARN,(check_type)pcVar11,(size_t)&local_1448,
             0x18c);
  boost::detail::shared_count::~shared_count(&local_9c0.m_message.pn);
  std::__cxx11::string::string<std::allocator<char>>
            (local_7b8,"listbanned",(allocator<char> *)&local_9c0);
  args_25._M_dataplus._M_p._4_4_ = uVar10;
  args_25._M_dataplus._M_p._0_4_ = uVar9;
  args_25._M_string_length = (size_type)pcVar11;
  args_25.field_2._M_allocated_capacity = (size_type)pcVar14;
  args_25.field_2._8_8_ = prVar15;
  RPCTestingSetup::CallRPC
            ((UniValue *)local_340,&this_00->super_BOOST_AUTO_TEST_CASE_FIXTURE,args_25);
  UniValue::operator=(&r,(UniValue *)local_340);
  UniValue::~UniValue((UniValue *)local_340);
  std::__cxx11::string::~string(local_7b8);
  local_1488 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_1480 = "";
  local_1498 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1490 = &boost::unit_test::basic_cstring<char_const>::null;
  file_41.m_end = (iterator)0x18d;
  file_41.m_begin = (iterator)&local_1488;
  msg_41.m_end = pvVar5;
  msg_41.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_41,(size_t)&local_1498,
             msg_41);
  local_9c0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)0x1;
  local_9c0.m_message.px = (element_type *)0x0;
  local_9c0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_340[8] = false;
  local_340._0_8_ = &PTR__lazy_ostream_01149250;
  local_330 = boost::unit_test::lazy_ostream::inst;
  local_328[0] = "no exceptions thrown by r = CallRPC(std::string(\"listbanned\"))";
  local_14a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_14a0 = "";
  pvVar4 = &DAT_00000001;
  pvVar5 = &DAT_00000001;
  boost::test_tools::tt_detail::report_assertion
            (&local_9c0,(lazy_ostream *)local_340,1,1,WARN,(check_type)pcVar11,(size_t)&local_14a8,
             0x18d);
  boost::detail::shared_count::~shared_count(&local_9c0.m_message.pn);
  pUVar1 = UniValue::get_array(&r);
  UniValue::operator=(&ar,pUVar1);
  pUVar1 = UniValue::operator[](&ar,0);
  pUVar1 = UniValue::get_obj(pUVar1);
  UniValue::operator=(&o1,pUVar1);
  key_09._M_str = "address";
  key_09._M_len = 7;
  pUVar1 = UniValue::find_value(&o1,key_09);
  UniValue::operator=(&adr,pUVar1);
  local_14e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_14e0 = "";
  local_14f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_14f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_42.m_end = (iterator)0x191;
  file_42.m_begin = (iterator)&local_14e8;
  msg_42.m_end = pvVar5;
  msg_42.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_42,(size_t)&local_14f8,
             msg_42);
  local_340[8] = false;
  local_340._0_8_ = &PTR__lazy_ostream_011480b0;
  local_330 = boost::unit_test::lazy_ostream::inst;
  local_328[0] = (char *)((long)"\x05\x04\x03\x02\x01" + 5);
  local_1508 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_1500 = "";
  psVar2 = UniValue::get_str_abi_cxx11_(&adr);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[43]>
            (local_340,&local_1508,0x191,1,2,psVar2,0xbd3ed0,
             "2001:4d48:ac57:400:cacf:e9ff:fe1d:9c63/128",
             "\"2001:4d48:ac57:400:cacf:e9ff:fe1d:9c63/128\"");
  UniValue::~UniValue(&adr);
  UniValue::~UniValue(&o1);
  UniValue::~UniValue(&ar);
  UniValue::~UniValue(&r);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(rpc_ban)
{
    BOOST_CHECK_NO_THROW(CallRPC(std::string("clearbanned")));

    UniValue r;
    BOOST_CHECK_NO_THROW(r = CallRPC(std::string("setban 127.0.0.0 add")));
    BOOST_CHECK_THROW(r = CallRPC(std::string("setban 127.0.0.0:8334")), std::runtime_error); //portnumber for setban not allowed
    BOOST_CHECK_NO_THROW(r = CallRPC(std::string("listbanned")));
    UniValue ar = r.get_array();
    UniValue o1 = ar[0].get_obj();
    UniValue adr = o1.find_value("address");
    BOOST_CHECK_EQUAL(adr.get_str(), "127.0.0.0/32");
    BOOST_CHECK_NO_THROW(CallRPC(std::string("setban 127.0.0.0 remove")));
    BOOST_CHECK_NO_THROW(r = CallRPC(std::string("listbanned")));
    ar = r.get_array();
    BOOST_CHECK_EQUAL(ar.size(), 0U);

    BOOST_CHECK_NO_THROW(r = CallRPC(std::string("setban 127.0.0.0/24 add 9907731200 true")));
    BOOST_CHECK_NO_THROW(r = CallRPC(std::string("listbanned")));
    ar = r.get_array();
    o1 = ar[0].get_obj();
    adr = o1.find_value("address");
    int64_t banned_until{o1.find_value("banned_until").getInt<int64_t>()};
    BOOST_CHECK_EQUAL(adr.get_str(), "127.0.0.0/24");
    BOOST_CHECK_EQUAL(banned_until, 9907731200); // absolute time check

    BOOST_CHECK_NO_THROW(CallRPC(std::string("clearbanned")));

    auto now = 10'000s;
    SetMockTime(now);
    BOOST_CHECK_NO_THROW(r = CallRPC(std::string("setban 127.0.0.0/24 add 200")));
    SetMockTime(now += 2s);
    const int64_t time_remaining_expected{198};
    BOOST_CHECK_NO_THROW(r = CallRPC(std::string("listbanned")));
    ar = r.get_array();
    o1 = ar[0].get_obj();
    adr = o1.find_value("address");
    banned_until = o1.find_value("banned_until").getInt<int64_t>();
    const int64_t ban_created{o1.find_value("ban_created").getInt<int64_t>()};
    const int64_t ban_duration{o1.find_value("ban_duration").getInt<int64_t>()};
    const int64_t time_remaining{o1.find_value("time_remaining").getInt<int64_t>()};
    BOOST_CHECK_EQUAL(adr.get_str(), "127.0.0.0/24");
    BOOST_CHECK_EQUAL(banned_until, time_remaining_expected + now.count());
    BOOST_CHECK_EQUAL(ban_duration, banned_until - ban_created);
    BOOST_CHECK_EQUAL(time_remaining, time_remaining_expected);

    // must throw an exception because 127.0.0.1 is in already banned subnet range
    BOOST_CHECK_THROW(r = CallRPC(std::string("setban 127.0.0.1 add")), std::runtime_error);

    BOOST_CHECK_NO_THROW(CallRPC(std::string("setban 127.0.0.0/24 remove")));
    BOOST_CHECK_NO_THROW(r = CallRPC(std::string("listbanned")));
    ar = r.get_array();
    BOOST_CHECK_EQUAL(ar.size(), 0U);

    BOOST_CHECK_NO_THROW(r = CallRPC(std::string("setban 127.0.0.0/255.255.0.0 add")));
    BOOST_CHECK_THROW(r = CallRPC(std::string("setban 127.0.1.1 add")), std::runtime_error);

    BOOST_CHECK_NO_THROW(CallRPC(std::string("clearbanned")));
    BOOST_CHECK_NO_THROW(r = CallRPC(std::string("listbanned")));
    ar = r.get_array();
    BOOST_CHECK_EQUAL(ar.size(), 0U);


    BOOST_CHECK_THROW(r = CallRPC(std::string("setban test add")), std::runtime_error); //invalid IP

    //IPv6 tests
    BOOST_CHECK_NO_THROW(r = CallRPC(std::string("setban FE80:0000:0000:0000:0202:B3FF:FE1E:8329 add")));
    BOOST_CHECK_NO_THROW(r = CallRPC(std::string("listbanned")));
    ar = r.get_array();
    o1 = ar[0].get_obj();
    adr = o1.find_value("address");
    BOOST_CHECK_EQUAL(adr.get_str(), "fe80::202:b3ff:fe1e:8329/128");

    BOOST_CHECK_NO_THROW(CallRPC(std::string("clearbanned")));
    BOOST_CHECK_NO_THROW(r = CallRPC(std::string("setban 2001:db8::/ffff:fffc:0:0:0:0:0:0 add")));
    BOOST_CHECK_NO_THROW(r = CallRPC(std::string("listbanned")));
    ar = r.get_array();
    o1 = ar[0].get_obj();
    adr = o1.find_value("address");
    BOOST_CHECK_EQUAL(adr.get_str(), "2001:db8::/30");

    BOOST_CHECK_NO_THROW(CallRPC(std::string("clearbanned")));
    BOOST_CHECK_NO_THROW(r = CallRPC(std::string("setban 2001:4d48:ac57:400:cacf:e9ff:fe1d:9c63/128 add")));
    BOOST_CHECK_NO_THROW(r = CallRPC(std::string("listbanned")));
    ar = r.get_array();
    o1 = ar[0].get_obj();
    adr = o1.find_value("address");
    BOOST_CHECK_EQUAL(adr.get_str(), "2001:4d48:ac57:400:cacf:e9ff:fe1d:9c63/128");
}